

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O3

void __thiscall
coinscachepair_tests::linked_list_random_deletion::test_method(linked_list_random_deletion *this)

{
  CoinsCachePair *pCVar1;
  iterator __position;
  iterator __position_00;
  CoinsCachePair *sentinel;
  CoinsCachePair *pCVar2;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  CoinsCachePair *local_1a8;
  CoinsCachePair *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  lazy_ostream local_178;
  undefined1 *local_168;
  char *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char *local_148;
  char *local_140;
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  nodes;
  CoinsCachePair **local_120;
  undefined **local_118;
  undefined1 local_110;
  undefined1 *local_108;
  CoinsCachePair ***local_100;
  CoinsCachePair **local_f8;
  undefined **local_f0;
  undefined1 local_e8;
  undefined1 *local_e0;
  CoinsCachePair ***local_d8;
  char *local_d0;
  char *local_c8;
  assertion_result local_c0;
  CoinsCachePair local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a8.first.n = 0xffffffff;
  local_a8.second.m_prev = (CoinsCachePair *)0x0;
  local_a8.second.m_next = (CoinsCachePair *)0x0;
  local_a8.second.m_flags = '\0';
  local_a8.second._17_7_ = 0;
  local_a8.second.coin.out.nValue = 0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
       (char *)0x0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = 0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._24_8_ = 0;
  local_a8.second.coin._40_8_ = 0;
  CCoinsCacheEntry::CCoinsCacheEntry(&local_a8.second);
  local_a8.second.m_prev = &local_a8;
  local_a8.second.m_flags = '\x01';
  local_a8.second.m_next = local_a8.second.m_prev;
  CreatePairs_abi_cxx11_(&nodes,(coinscachepair_tests *)local_a8.second.m_prev,sentinel);
  __position._M_node =
       (nodes.
        super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
        ._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_next;
  __position_00._M_node = (__position._M_node)->_M_next;
  std::__cxx11::
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::_M_erase(&nodes,(nodes.
                     super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                     ._M_impl._M_node.super__List_node_base._M_next)->_M_next);
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_140 = "";
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x6c;
  file.m_begin = (iterator)&local_148;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_158,msg);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_f8 = &local_1a8;
  local_1a8 = (CoinsCachePair *)
              CONCAT71(local_1a8._1_7_,
                       *(char *)&nodes.
                                 super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                                 ._M_impl._M_node.super__List_node_base._M_next[4]._M_prev);
  local_120 = &local_1a0;
  local_1a0 = (CoinsCachePair *)CONCAT44(local_1a0._4_4_,1);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*(char *)&nodes.
                  super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next[4]._M_prev == '\x01');
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_d8 = &local_f8;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013aee50;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013af730;
  local_108 = boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe7497a,(size_t)&local_d0,0x6c,&local_f0,
             "CCoinsCacheEntry::DIRTY",&local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x6d;
  file_00.m_begin = (iterator)&local_188;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_198,
             msg_00);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = (CoinsCachePair *)
              nodes.
              super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
              ._M_impl._M_node.super__List_node_base._M_next[4]._M_next;
  pCVar2 = (CoinsCachePair *)(__position._M_node + 1);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1a0 == pCVar2);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_e8 = 0;
  local_110 = 0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_1a8 = pCVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe74990,(size_t)&local_d0,0x6d,&local_f0,"&(*n3)",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x6e;
  file_01.m_begin = (iterator)&local_1b8;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c8,
             msg_01);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a8 = (CoinsCachePair *)CONCAT71(local_1a8._1_7_,*(char *)&__position._M_node[4]._M_prev);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*(char *)&__position._M_node[4]._M_prev == '\x01');
  local_1a0 = (CoinsCachePair *)CONCAT44(local_1a0._4_4_,1);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 0;
  local_110 = 0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a8;
  local_f0 = &PTR__lazy_ostream_013aee50;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a0;
  local_118 = &PTR__lazy_ostream_013af730;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe749a9,(size_t)&local_d0,0x6e,&local_f0,
             "CCoinsCacheEntry::DIRTY",&local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1d0 = "";
  local_1e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x6f;
  file_02.m_begin = (iterator)&local_1d8;
  msg_02.m_end = pvVar4;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1e8,
             msg_02);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = (CoinsCachePair *)__position._M_node[4]._M_next;
  pCVar1 = (CoinsCachePair *)(__position_00._M_node + 1);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1a0 == pCVar1);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 0;
  local_110 = 0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_1a8 = pCVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe749bf,(size_t)&local_d0,0x6f,&local_f0,"&(*n4)",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x70;
  file_03.m_begin = (iterator)&local_1f8;
  msg_03.m_end = pvVar4;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_208,
             msg_03);
  local_1a8 = (CoinsCachePair *)
              (nodes.
               super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
               ._M_impl._M_node.super__List_node_base._M_next + 1);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = (CoinsCachePair *)__position._M_node[3]._M_prev;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1a0 == local_1a8);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 0;
  local_110 = 0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe749d8,(size_t)&local_d0,0x70,&local_f0,"&(*n1)",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  std::__cxx11::
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::_M_erase(&nodes,(iterator)
                    nodes.
                    super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
                    ._M_impl._M_node.super__List_node_base._M_next);
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x77;
  file_04.m_begin = (iterator)&local_218;
  msg_04.m_end = pvVar4;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_228,
             msg_04);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a8 = (CoinsCachePair *)CONCAT71(local_1a8._1_7_,*(char *)&__position._M_node[4]._M_prev);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*(char *)&__position._M_node[4]._M_prev == '\x01');
  local_1a0 = (CoinsCachePair *)CONCAT44(local_1a0._4_4_,1);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 0;
  local_110 = 0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a8;
  local_f0 = &PTR__lazy_ostream_013aee50;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a0;
  local_118 = &PTR__lazy_ostream_013af730;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe749a9,(size_t)&local_d0,0x77,&local_f0,
             "CCoinsCacheEntry::DIRTY",&local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x78;
  file_05.m_begin = (iterator)&local_238;
  msg_05.m_end = pvVar4;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_248,
             msg_05);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = local_a8.second.m_next;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_next == pCVar2);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_1a8 = pCVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe7490a,(size_t)&local_d0,0x78,&local_f0,"&(*n3)",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x79;
  file_06.m_begin = (iterator)&local_258;
  msg_06.m_end = pvVar4;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_268,
             msg_06);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = (CoinsCachePair *)__position._M_node[4]._M_next;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1a0 == pCVar1);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_1a8 = pCVar1;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe749bf,(size_t)&local_d0,0x79,&local_f0,"&(*n4)",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x7a;
  file_07.m_begin = (iterator)&local_278;
  msg_07.m_end = pvVar4;
  msg_07.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_288,
             msg_07);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = (CoinsCachePair *)__position._M_node[3]._M_prev;
  local_1a8 = &local_a8;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1a0 == local_1a8);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 0;
  local_110 = 0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe749d8,(size_t)&local_d0,0x7a,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  std::__cxx11::
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::_M_erase(&nodes,__position_00);
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x81;
  file_08.m_begin = (iterator)&local_298;
  msg_08.m_end = pvVar4;
  msg_08.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2a8,
             msg_08);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013aee50;
  local_1a8 = (CoinsCachePair *)CONCAT71(local_1a8._1_7_,*(char *)&__position._M_node[4]._M_prev);
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(*(char *)&__position._M_node[4]._M_prev == '\x01');
  local_1a0 = (CoinsCachePair *)CONCAT44(local_1a0._4_4_,1);
  local_110 = 0;
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_118 = &PTR__lazy_ostream_013af730;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a8;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a0;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe749a9,(size_t)&local_d0,0x81,&local_f0,
             "CCoinsCacheEntry::DIRTY",&local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x82;
  file_09.m_begin = (iterator)&local_2b8;
  msg_09.m_end = pvVar4;
  msg_09.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2c8,
             msg_09);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = local_a8.second.m_next;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_next == pCVar2);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_1a8 = pCVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe7490a,(size_t)&local_d0,0x82,&local_f0,"&(*n3)",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x83;
  file_10.m_begin = (iterator)&local_2d8;
  msg_10.m_end = pvVar4;
  msg_10.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2e8,
             msg_10);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = (CoinsCachePair *)__position._M_node[4]._M_next;
  local_1a8 = &local_a8;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_1a0 == local_1a8);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_e8 = 0;
  local_110 = 0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe749bf,(size_t)&local_d0,0x83,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x84;
  file_11.m_begin = (iterator)&local_2f8;
  msg_11.m_end = pvVar4;
  msg_11.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_308,
             msg_11);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = local_a8.second.m_prev;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_prev == pCVar2);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  local_1a8 = pCVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe74883,(size_t)&local_d0,0x84,&local_f0,"&(*n3)",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  std::__cxx11::
  list<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::_M_erase(&nodes,__position);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x8a;
  file_12.m_begin = (iterator)&local_318;
  msg_12.m_end = pvVar4;
  msg_12.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_328,
             msg_12);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = local_a8.second.m_next;
  local_1a8 = &local_a8;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_next == local_1a8);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe7490a,(size_t)&local_d0,0x8a,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x8b;
  file_13.m_begin = (iterator)&local_338;
  msg_13.m_end = pvVar4;
  msg_13.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_348,
             msg_13);
  local_178.m_empty = false;
  local_178._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_168 = boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_1a0 = local_a8.second.m_prev;
  local_1a8 = &local_a8;
  local_c0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_prev == local_1a8);
  local_c0.m_message.px = (element_type *)0x0;
  local_c0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_c8 = "";
  local_f8 = &local_1a0;
  local_e8 = 0;
  local_f0 = &PTR__lazy_ostream_013af770;
  local_e0 = boost::unit_test::lazy_ostream::inst;
  local_d8 = &local_f8;
  local_120 = &local_1a8;
  local_110 = 0;
  local_118 = &PTR__lazy_ostream_013af770;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = &local_120;
  boost::test_tools::tt_detail::report_assertion
            (&local_c0,&local_178,1,2,REQUIRE,0xe74883,(size_t)&local_d0,0x8b,&local_f0,"&sentinel",
             &local_118);
  boost::detail::shared_count::~shared_count(&local_c0.m_message.pn);
  std::__cxx11::
  _List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
  ::_M_clear(&nodes.
              super__List_base<std::pair<const_COutPoint,_CCoinsCacheEntry>,_std::allocator<std::pair<const_COutPoint,_CCoinsCacheEntry>_>_>
            );
  pCVar2 = local_a8.second.m_next;
  pCVar1 = local_a8.second.m_prev;
  if (local_a8.second.m_flags != '\0') {
    ((local_a8.second.m_next)->second).m_prev = local_a8.second.m_prev;
    (pCVar1->second).m_next = pCVar2;
    local_a8.second.m_flags = '\0';
  }
  if (0x1c < local_a8.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(linked_list_random_deletion)
{
    CoinsCachePair sentinel;
    sentinel.second.SelfRef(sentinel);
    auto nodes{CreatePairs(sentinel)};

    // Create linked list sentinel->n1->n2->n3->n4->sentinel
    auto n1{nodes.begin()};
    auto n2{std::next(n1)};
    auto n3{std::next(n2)};
    auto n4{std::next(n3)};

    // Delete n2
    // sentinel->n1->n3->n4->sentinel
    nodes.erase(n2);
    // Check that n1 now points to n3, and n3 still points to n4
    // Also check that flags were not altered
    BOOST_CHECK_EQUAL(n1->second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n1->second.Next(), &(*n3));
    BOOST_CHECK_EQUAL(n3->second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n3->second.Next(), &(*n4));
    BOOST_CHECK_EQUAL(n3->second.Prev(), &(*n1));

    // Delete n1
    // sentinel->n3->n4->sentinel
    nodes.erase(n1);
    // Check that sentinel now points to n3, and n3 still points to n4
    // Also check that flags were not altered
    BOOST_CHECK_EQUAL(n3->second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &(*n3));
    BOOST_CHECK_EQUAL(n3->second.Next(), &(*n4));
    BOOST_CHECK_EQUAL(n3->second.Prev(), &sentinel);

    // Delete n4
    // sentinel->n3->sentinel
    nodes.erase(n4);
    // Check that sentinel still points to n3, and n3 points to sentinel
    // Also check that flags were not altered
    BOOST_CHECK_EQUAL(n3->second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &(*n3));
    BOOST_CHECK_EQUAL(n3->second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &(*n3));

    // Delete n3
    // sentinel->sentinel
    nodes.erase(n3);
    // Check that sentinel's next and prev are itself
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &sentinel);
}